

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListModel.cpp
# Opt level: O0

void __thiscall QColorListModel::setNameFormat(QColorListModel *this,NameFormat nameFormat)

{
  int iVar1;
  undefined4 in_ESI;
  QModelIndex *in_RDI;
  QModelIndex *pQVar2;
  parameter_type t;
  QModelIndex local_a0;
  QModelIndex local_88;
  undefined1 local_70 [24];
  QModelIndex local_58;
  undefined1 local_40 [24];
  QModelIndex local_28;
  
  *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x18) = in_ESI;
  QModelIndex::QModelIndex(&local_28);
  iVar1 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,&local_28);
  if (0 < iVar1) {
    pQVar2 = &local_58;
    QModelIndex::QModelIndex(pQVar2);
    (**(code **)(*(long *)in_RDI + 0x60))(local_40,in_RDI,0,0,pQVar2);
    t = (parameter_type)((ulong)pQVar2 >> 0x20);
    pQVar2 = &local_88;
    QModelIndex::QModelIndex(pQVar2);
    iVar1 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,pQVar2);
    QModelIndex::QModelIndex(&local_a0);
    (**(code **)(*(long *)in_RDI + 0x60))(local_70,in_RDI,iVar1 + -1,0,&local_a0);
    QList<int>::QList((QList<int> *)0x2092aa);
    QList<int>::operator<<((QList<int> *)pQVar2,t);
    QAbstractItemModel::dataChanged(in_RDI,(QModelIndex *)local_40,(QList_conflict1 *)local_70);
    QList<int>::~QList((QList<int> *)0x2092ea);
  }
  return;
}

Assistant:

void QColorListModel::setNameFormat(QColorListModel::NameFormat nameFormat) {
    d->nameFormat = nameFormat;

    if (rowCount() > 0) {
        Q_EMIT dataChanged(index(0, 0), index(rowCount() - 1, 0), QVector<int>() << Qt::DisplayRole);
    }
}